

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O2

void remove_mon(coord *mp,MonsterThing *tp,bool waskill)

{
  int x;
  int y;
  _List_node_base *p_Var1;
  bool bVar2;
  int display_char;
  _Self __tmp;
  _List_node_base *p_Var3;
  MonsterThing *pMVar4;
  ItemThing *obj;
  MonsterThing *local_40;
  ItemThing *local_38;
  
  p_Var3 = (tp->pack).super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  local_40 = tp;
  while (p_Var3 != (_List_node_base *)&tp->pack) {
    p_Var1 = p_Var3->_M_next;
    local_38 = (ItemThing *)p_Var3[1]._M_next;
    local_38->pos = tp->pos;
    std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::remove
              (&tp->pack,(char *)&local_38);
    p_Var3 = p_Var1;
    if (waskill) {
      fall(local_38,false);
    }
    else {
      operator_delete(local_38);
    }
  }
  places[(long)(mp->x << 5) + (long)mp->y].p_monst = (MonsterThing *)0x0;
  std::__cxx11::list<MonsterThing_*,_std::allocator<MonsterThing_*>_>::remove
            (&mlist_abi_cxx11_,(char *)&local_40);
  bVar2 = see_monst(local_40);
  if (bVar2) {
    x = mp->x;
    y = mp->y;
    display_char = char_at_place(x,y);
    setMapDisplay(x,y,display_char);
  }
  if ((local_40->flags & 0x80) != 0) {
    kamikaze = false;
    to_death = false;
    if (fight_flush == true) {
      flush_type();
      if (local_40 == (MonsterThing *)0x0) {
        pMVar4 = (MonsterThing *)0x0;
        goto LAB_00120313;
      }
    }
  }
  pMVar4 = local_40;
  std::__cxx11::_List_base<ItemThing_*,_std::allocator<ItemThing_*>_>::_M_clear
            (&(local_40->pack).super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>);
LAB_00120313:
  operator_delete(pMVar4);
  return;
}

Assistant:

void remove_mon(coord *mp, MonsterThing *tp, bool waskill)
{
    for(auto it = tp->pack.begin(); it != tp->pack.end(); )
    {
        ItemThing* obj = *it++;
        obj->pos = tp->pos;
        tp->pack.remove(obj);
        if (waskill)
            fall(obj, false);
        else
            delete obj;
    }
    monster_at(mp->x, mp->y) = nullptr;
    mlist.remove(tp);
    if (see_monst(tp))
        setMapDisplay(mp->x, mp->y, char_at_place(mp->x, mp->y));
    if (on(*tp, ISTARGET))
    {
        kamikaze = false;
        to_death = false;
        if (fight_flush)
            flush_type();
    }
    delete tp;
}